

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext *ctx,ExprZeroInitialize *node)

{
  LLVMBuilderRef pLVar1;
  TypeRef *pTVar2;
  LLVMValueRef pLVar3;
  LLVMTypeRef pLVar4;
  LLVMValueRef pLVar5;
  LLVMValueRef address;
  TypeRef *refType;
  ExprZeroInitialize *node_local;
  LlvmCompilationContext *ctx_local;
  
  pTVar2 = getType<TypeRef>(node->address->type);
  if (pTVar2 != (TypeRef *)0x0) {
    pLVar3 = CompileLlvm(ctx,node->address);
    pLVar1 = ctx->builder;
    pLVar4 = CompileLlvmType(ctx,pTVar2->subType);
    pLVar5 = LLVMConstNull(pLVar4);
    LLVMBuildStore(pLVar1,pLVar5,pLVar3);
    pLVar3 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
    return pLVar3;
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x61f,
                "LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext &, ExprZeroInitialize *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext &ctx, ExprZeroInitialize *node)
{
	TypeRef *refType = getType<TypeRef>(node->address->type);

	assert(refType);

	LLVMValueRef address = CompileLlvm(ctx, node->address);

	LLVMBuildStore(ctx.builder, LLVMConstNull(CompileLlvmType(ctx, refType->subType)), address);

	return CheckType(ctx, node, NULL);
}